

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O0

int Abc_CommandAbcLivenessToSafetyAbstraction(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  FILE *__stream;
  Abc_Ntk_t *pNtk_00;
  Vec_Int_t *vFlops_00;
  char *pcVar3;
  int local_b4;
  Vec_Int_t *vFlops;
  Vec_Ptr_t *pVStack_90;
  int directive;
  Vec_Ptr_t *vAssumeSafety;
  Vec_Ptr_t *vAssertSafety;
  Vec_Ptr_t *vFair;
  Vec_Ptr_t *vLive;
  Aig_Man_t *pAStack_68;
  int c;
  Aig_Man_t *pAigNew;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtkOld;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  FILE *pErr;
  FILE *pOut;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAStack_68 = (Aig_Man_t *)0x0;
  vFlops._4_4_ = -1;
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  if (argc == 1) {
    vFlops._4_4_ = 0;
LAB_007c88a7:
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      fprintf(__stream,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        printf("The input network was not strashed, strashing....\n");
        pNtk_00 = Abc_NtkStrash(pAVar2,0,0,0);
        pAigNew = Abc_NtkToDar(pNtk_00,0,1);
        vFair = populateLivenessVector(pAVar2,pAigNew);
        vAssertSafety = populateFairnessVector(pAVar2,pAigNew);
        vAssumeSafety = populateSafetyAssertionVector(pAVar2,pAigNew);
        pVStack_90 = populateSafetyAssumptionVector(pAVar2,pAigNew);
      }
      else {
        pAigNew = Abc_NtkToDar(pAVar2,0,1);
        vFair = populateLivenessVector(pAVar2,pAigNew);
        vAssertSafety = populateFairnessVector(pAVar2,pAigNew);
        vAssumeSafety = populateSafetyAssertionVector(pAVar2,pAigNew);
        pVStack_90 = populateSafetyAssumptionVector(pAVar2,pAigNew);
      }
      iVar1 = Aig_ManRegNum(pAigNew);
      if (iVar1 % 2 == 0) {
        local_b4 = Aig_ManRegNum(pAigNew);
      }
      else {
        local_b4 = Aig_ManRegNum(pAigNew);
        local_b4 = local_b4 + -1;
      }
      local_b4 = local_b4 / 2;
      vFlops_00 = prepareFlopVector(pAigNew,local_b4);
      switch(vFlops._4_4_) {
      case 0:
        pAStack_68 = LivenessToSafetyTransformationAbs
                               (0,pAVar2,pAigNew,vFlops_00,vFair,vAssertSafety,vAssumeSafety,
                                pVStack_90);
        iVar1 = Aig_ManRegNum(pAStack_68);
        if (iVar1 != 0) {
          printf(
                "A new circuit is produced with\n\t2 POs - one for safety and one for liveness.\n\tone additional input is added (due to Biere\'s nondeterminism)\n\tshadow flops are not created if the original circuit is combinational\n\tnon-property POs are suppressed\n"
                );
        }
        break;
      case 1:
        pAStack_68 = LivenessToSafetyTransformationAbs
                               (1,pAVar2,pAigNew,vFlops_00,vFair,vAssertSafety,vAssumeSafety,
                                pVStack_90);
        iVar1 = Aig_ManRegNum(pAStack_68);
        if (iVar1 != 0) {
          printf(
                "A new circuit is produced with\n\t1 PO - only for safety property; liveness properties are ignored, if any.\n\tno additional input is added (due to Biere\'s nondeterminism)\n\tshadow flops are not created\n\tnon-property POs are suppressed\n"
                );
        }
        break;
      case 2:
        pAStack_68 = LivenessToSafetyTransformationAbs
                               (2,pAVar2,pAigNew,vFlops_00,vFair,vAssertSafety,vAssumeSafety,
                                pVStack_90);
        iVar1 = Aig_ManRegNum(pAStack_68);
        if (iVar1 != 0) {
          printf(
                "A new circuit is produced with\n\t1 PO - only for liveness property; safety properties are ignored, if any.\n\tone additional input is added (due to Biere\'s nondeterminism)\n\tshadow flops are not created if the original circuit is combinational\n\tnon-property POs are suppressed\n"
                );
        }
        break;
      case 3:
        pAStack_68 = LivenessToSafetyTransformationOneStepLoop
                               (3,pAVar2,pAigNew,vFair,vAssertSafety,vAssumeSafety,pVStack_90);
        iVar1 = Aig_ManRegNum(pAStack_68);
        if (iVar1 != 0) {
          printf(
                "New circuit is produced ignoring safety outputs!\nOnly liveness and fairness outputs are considered.\nShadow registers are not created\n"
                );
        }
        break;
      case 4:
        pAStack_68 = LivenessToSafetyTransformationOneStepLoop
                               (4,pAVar2,pAigNew,vFair,vAssertSafety,vAssumeSafety,pVStack_90);
        iVar1 = Aig_ManRegNum(pAStack_68);
        if (iVar1 != 0) {
          printf(
                "A new circuit is produced with\n\t2 POs - one for safety and one for liveness.\n\tone additional input is added (due to Biere\'s nondeterminism)\n\tshadow flops are not created\n\tnon-property POs are suppressed\n"
                );
        }
      }
      pAVar2 = Abc_NtkFromAigPhase(pAStack_68);
      pcVar3 = Abc_UtilStrsav(pAStack_68->pName);
      pAVar2->pName = pcVar3;
      iVar1 = Abc_NtkCheck(pAVar2);
      if (iVar1 == 0) {
        fprintf(_stdout,"Abc_NtkCreateCone(): Network check has failed.\n");
      }
      updateNewNetworkNameManager(pAVar2,pAStack_68,vecPiNames,vecLoNames);
      Abc_FrameSetCurrentNetwork(pAbc,pAVar2);
      pAbc_local._4_4_ = 0;
    }
    return pAbc_local._4_4_;
  }
  Extra_UtilGetoptReset();
LAB_007c8715:
  iVar1 = Extra_UtilGetopt(argc,argv,"1slh");
  if (iVar1 == -1) goto LAB_007c88a7;
  if (iVar1 == 0x31) {
    if (vFlops._4_4_ == -1) {
      vFlops._4_4_ = 4;
    }
    else {
      if ((vFlops._4_4_ != 1) && (vFlops._4_4_ != 2)) {
        __assert_fail("directive == IGNORE_LIVENESS_KEEP_SAFETY_MODE || directive == IGNORE_SAFETY_KEEP_LIVENESS_MODE"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/liveness.c"
                      ,0x65e,
                      "int Abc_CommandAbcLivenessToSafetyAbstraction(Abc_Frame_t *, int, char **)");
      }
      if (vFlops._4_4_ == 1) {
        vFlops._4_4_ = 1;
      }
      else {
        vFlops._4_4_ = 3;
      }
    }
    goto LAB_007c8715;
  }
  if (iVar1 != 0x68) {
    if (iVar1 == 0x6c) {
      if ((vFlops._4_4_ != -1) && (vFlops._4_4_ != 4)) goto LAB_007c8c81;
      vFlops._4_4_ = 1;
      goto LAB_007c8715;
    }
    if (iVar1 != 0x73) goto LAB_007c8c81;
    if (vFlops._4_4_ == -1) {
      vFlops._4_4_ = 2;
      goto LAB_007c8715;
    }
    if (vFlops._4_4_ == 4) {
      vFlops._4_4_ = 3;
      goto LAB_007c8715;
    }
  }
LAB_007c8c81:
  fprintf(_stdout,"usage: l2s [-1lsh]\n");
  fprintf(_stdout,"\t         performs Armin Biere\'s live-to-safe transformation\n");
  fprintf(_stdout,"\t-1 : no shadow logic, presume all loops are self loops\n");
  fprintf(_stdout,"\t-l : ignore liveness and fairness outputs\n");
  fprintf(_stdout,"\t-s : ignore safety assertions and assumptions\n");
  fprintf(_stdout,"\t-h : print command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbcLivenessToSafetyAbstraction( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk, * pNtkTemp, *pNtkNew, *pNtkOld;
    Aig_Man_t * pAig, *pAigNew = NULL;
    int c;
    Vec_Ptr_t * vLive, * vFair, *vAssertSafety, *vAssumeSafety;
    int directive = -1;
    Vec_Int_t * vFlops;
                
    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    if( argc == 1 )
    {
        assert( directive == -1 );
        directive = FULL_BIERE_MODE;
    }
    else
    {
        Extra_UtilGetoptReset();
        while ( ( c = Extra_UtilGetopt( argc, argv, "1slh" ) ) != EOF )
        {
            switch( c )
            {
            case '1': 
                if( directive == -1 )
                    directive = FULL_BIERE_ONE_LOOP_MODE;
                else
                {
                    assert( directive == IGNORE_LIVENESS_KEEP_SAFETY_MODE || directive == IGNORE_SAFETY_KEEP_LIVENESS_MODE );
                    if( directive == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
                        directive = IGNORE_LIVENESS_KEEP_SAFETY_MODE;
                    else
                        directive = IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE;
                }
                break;
            case 's':
                if( directive == -1 )
                    directive = IGNORE_SAFETY_KEEP_LIVENESS_MODE;
                else
                {
                    if( directive != FULL_BIERE_ONE_LOOP_MODE )
                        goto usage;
                    assert(directive == FULL_BIERE_ONE_LOOP_MODE);
                    directive = IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE;
                }
                break;
            case 'l':
                if( directive == -1 )
                    directive = IGNORE_LIVENESS_KEEP_SAFETY_MODE;
                else
                {
                    if( directive != FULL_BIERE_ONE_LOOP_MODE )
                        goto usage;
                    assert(directive == FULL_BIERE_ONE_LOOP_MODE);
                    directive = IGNORE_LIVENESS_KEEP_SAFETY_MODE;
                }
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
            }
        }
    }

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        return 1;
    }
    if( !Abc_NtkIsStrash( pNtk ) )
    {
        printf("The input network was not strashed, strashing....\n");
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkOld = pNtkTemp;
        pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
        vAssertSafety = populateSafetyAssertionVector( pNtk, pAig );
        vAssumeSafety = populateSafetyAssumptionVector( pNtk, pAig );
    }
    else
    {
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        pNtkOld = pNtk;
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
        vAssertSafety = populateSafetyAssertionVector( pNtk, pAig );
        vAssumeSafety = populateSafetyAssumptionVector( pNtk, pAig );
    }

    vFlops = prepareFlopVector( pAig, Aig_ManRegNum(pAig)%2 == 0? Aig_ManRegNum(pAig)/2 : (Aig_ManRegNum(pAig)-1)/2);

    //vFlops = prepareFlopVector( pAig, 100 );

    switch( directive )
    {
    case FULL_BIERE_MODE:
        //if( Vec_PtrSize(vLive) == 0 && Vec_PtrSize(vAssertSafety) == 0 )
        //{
        //    printf("Input circuit has NO safety and NO liveness property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationAbs( FULL_BIERE_MODE, pNtk, pAig, vFlops, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("A new circuit is produced with\n\t2 POs - one for safety and one for liveness.\n\tone additional input is added (due to Biere's nondeterminism)\n\tshadow flops are not created if the original circuit is combinational\n\tnon-property POs are suppressed\n");
            break;
        //}
    case FULL_BIERE_ONE_LOOP_MODE:
        //if( Vec_PtrSize(vLive) == 0 && Vec_PtrSize(vAssertSafety) == 0 )
        //{
        //    printf("Input circuit has NO safety and NO liveness property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationOneStepLoop( FULL_BIERE_ONE_LOOP_MODE, pNtk, pAig, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("A new circuit is produced with\n\t2 POs - one for safety and one for liveness.\n\tone additional input is added (due to Biere's nondeterminism)\n\tshadow flops are not created\n\tnon-property POs are suppressed\n");
            break;
        //}
    case IGNORE_LIVENESS_KEEP_SAFETY_MODE:
        //if( Vec_PtrSize(vAssertSafety) == 0 )
        //{    
        //    printf("Input circuit has NO safety property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationAbs( IGNORE_LIVENESS_KEEP_SAFETY_MODE, pNtk, pAig, vFlops, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("A new circuit is produced with\n\t1 PO - only for safety property; liveness properties are ignored, if any.\n\tno additional input is added (due to Biere's nondeterminism)\n\tshadow flops are not created\n\tnon-property POs are suppressed\n");
            break;
        //}
    case IGNORE_SAFETY_KEEP_LIVENESS_MODE:
        //if( Vec_PtrSize(vLive) == 0 )
        //{    
        //    printf("Input circuit has NO liveness property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationAbs( IGNORE_SAFETY_KEEP_LIVENESS_MODE, pNtk, pAig, vFlops, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("A new circuit is produced with\n\t1 PO - only for liveness property; safety properties are ignored, if any.\n\tone additional input is added (due to Biere's nondeterminism)\n\tshadow flops are not created if the original circuit is combinational\n\tnon-property POs are suppressed\n");
            break;
        //}
    case IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE:
        //if( Vec_PtrSize(vLive) == 0 )
        //{
        //    printf("Input circuit has NO liveness property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationOneStepLoop( IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE, pNtk, pAig, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("New circuit is produced ignoring safety outputs!\nOnly liveness and fairness outputs are considered.\nShadow registers are not created\n");
            break;
        //}
    }

    pNtkNew = Abc_NtkFromAigPhase( pAigNew );
    pNtkNew->pName = Abc_UtilStrsav( pAigNew->pName );
    
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
    
    updateNewNetworkNameManager( pNtkNew, pAigNew, vecPiNames,vecLoNames );
    Abc_FrameSetCurrentNetwork( pAbc, pNtkNew );

#if 0
#ifndef DUPLICATE_CKT_DEBUG
    Saig_ManForEachPi( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecPiNames, i), retrieveTruePiName( pNtk, pAig, pAigNew, pObj ) ) == 0 );
        //printf("Name of %d-th Pi = %s, %s\n", i, retrieveTruePiName( pNtk, pAig, pAigNew, pObj ), (char *)Vec_PtrEntry(vecPiNames, i) );

    Saig_ManForEachLo( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecLoNames, i), retrieveLOName( pNtk, pAig, pAigNew, pObj, vLive, vFair ) ) == 0 );
#endif    
#endif
        
    return 0;

usage:
    fprintf( stdout, "usage: l2s [-1lsh]\n" );
    fprintf( stdout, "\t         performs Armin Biere's live-to-safe transformation\n" );
    fprintf( stdout, "\t-1 : no shadow logic, presume all loops are self loops\n");
    fprintf( stdout, "\t-l : ignore liveness and fairness outputs\n");
    fprintf( stdout, "\t-s : ignore safety assertions and assumptions\n");
    fprintf( stdout, "\t-h : print command usage\n");
    return 1;
}